

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl10.c
# Opt level: O0

size_t th10_instr_size(uint version,thecl_instr_t *instr,_Bool is_timeline)

{
  int *piVar1;
  ssize_t sVar2;
  ulong local_58;
  size_t zlen;
  list_node_t *node;
  thecl_param_t *param;
  size_t ret;
  _Bool is_timeline_local;
  thecl_instr_t *instr_local;
  thecl_param_t *ptStack_10;
  uint version_local;
  
  if (is_timeline) {
    ptStack_10 = (thecl_param_t *)0x0;
  }
  else {
    param = (thecl_param_t *)0x10;
    for (zlen = (size_t)(instr->params).head; zlen != 0; zlen = *(size_t *)zlen) {
      piVar1 = *(int **)(zlen + 0x10);
      if ((*piVar1 == 0x6d) || (*piVar1 == 0x78)) {
        if ((g_ecl_encode_cp932 & 1U) == 0) {
          local_58 = strlen(*(char **)(piVar1 + 4));
        }
        else {
          local_58 = utf8_to_cp932_len(*(char **)(piVar1 + 4));
        }
        param = (thecl_param_t *)(local_58 + (8 - (local_58 & 3)) + (long)param);
      }
      else if ((*piVar1 == 0x6f) || (*piVar1 == 0x74)) {
        param = (thecl_param_t *)&param->field_0x4;
      }
      else {
        sVar2 = value_size((value_t *)(piVar1 + 2));
        param = (thecl_param_t *)((long)&param->type + sVar2);
      }
    }
    ptStack_10 = param;
  }
  return (size_t)ptStack_10;
}

Assistant:

static size_t
th10_instr_size(
    unsigned int version,
    const thecl_instr_t* instr,
    bool is_timeline)
{
    (void)version;
    if (is_timeline) return 0;

    size_t ret = sizeof(th10_instr_t);
    thecl_param_t* param;

    list_for_each(&instr->params, param) {
        /* XXX: I think 'z' is what will be passed ... */
        if (param->type == 'm' || param->type == 'x') {
            size_t zlen = g_ecl_encode_cp932 ? utf8_to_cp932_len(param->value.val.z) : strlen(param->value.val.z);
            ret += sizeof(uint32_t) + zlen + (4 - (zlen % 4));
        } else if (param->type == 'o' || param->type == 't') {
            ret += sizeof(uint32_t);
        } else {
            ret += value_size(&param->value);
        }
    }

    return ret;
}